

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>::
emplace_back_impl<QOpenGLFramebufferObjectPrivate::ColorAttachment>
          (QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment> *this,qsizetype prealloc,
          void *array,ColorAttachment *args)

{
  qsizetype *pqVar1;
  QSize *pQVar2;
  void *pvVar3;
  GLenum GVar4;
  undefined4 uVar5;
  long lVar6;
  
  lVar6 = (this->super_QVLABaseBase).s;
  if (lVar6 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar6 = (this->super_QVLABaseBase).s;
  }
  pvVar3 = (this->super_QVLABaseBase).ptr;
  lVar6 = lVar6 * 0x18;
  *(QOpenGLSharedResourceGuard **)((long)pvVar3 + lVar6 + 0x10) = args->guard;
  GVar4 = args->internalFormat;
  uVar5 = *(undefined4 *)&args->field_0xc;
  pQVar2 = (QSize *)((long)pvVar3 + lVar6);
  *pQVar2 = args->size;
  pQVar2[1].wd = (Representation)GVar4;
  pQVar2[1].ht = (Representation)uVar5;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar3 + lVar6);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }